

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::setPose(SlicePlane *this,vec3 planePosition,vec3 planeNormal)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined1 auVar4 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  vec<3,_float,_(glm::qualifier)0> vVar13;
  col_type local_b8;
  col_type local_a8;
  vec<3,_float,_(glm::qualifier)0> local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  vec<3,_float,_(glm::qualifier)0> local_78;
  vec<3,_float,_(glm::qualifier)0> local_68;
  mat<4,_4,_float,_(glm::qualifier)0> local_58;
  
  local_68.field_2 = planeNormal.field_2;
  auVar10._8_56_ = planeNormal._8_56_;
  auVar10._0_8_ = planeNormal._0_8_;
  local_88 = planePosition._0_8_;
  local_68._0_8_ = vmovlps_avx(auVar10._0_16_);
  local_78.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
       (this->objectTransform).value.value[1].field_2.z;
  local_78.field_0 =
       *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
        &(this->objectTransform).value.value[1].field_0;
  local_78.field_1 =
       *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
        &(this->objectTransform).value.value[1].field_1;
  local_98.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
       (this->objectTransform).value.value[2].field_2.z;
  auVar9 = (undefined1  [56])0x0;
  local_98.field_0 =
       *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
        &(this->objectTransform).value.value[2].field_0;
  local_98.field_1 =
       *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)
        &(this->objectTransform).value.value[2].field_1;
  uStack_80 = in_XMM0_Qb;
  vVar13 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_68);
  local_a8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar13.field_2;
  auVar6._0_8_ = vVar13._0_8_;
  auVar6._8_56_ = auVar9;
  local_a8._0_8_ = vmovlps_avx(auVar6._0_16_);
  fVar3 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                    ((vec<3,_float,_(glm::qualifier)0> *)&local_a8,&local_78);
  auVar11._8_8_ = 0;
  auVar11._0_4_ = local_78.field_0;
  auVar11._4_4_ = local_78.field_1;
  auVar4._0_4_ = fVar3 * local_a8.field_0.x;
  auVar4._4_4_ = fVar3 * local_a8.field_1.y;
  auVar4._8_4_ = fVar3 * 0.0;
  auVar4._12_4_ = fVar3 * 0.0;
  local_b8.field_2.z = local_78.field_2.z - fVar3 * local_a8.field_2.z;
  auVar4 = vsubps_avx(auVar11,auVar4);
  local_b8._0_8_ = vmovlps_avx(auVar4);
  fVar3 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call
                    ((vec<3,_float,_(glm::qualifier)0> *)&local_b8);
  uVar1 = extraout_XMM0_Qb;
  if (fVar3 < 0.01) {
    fVar3 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      ((vec<3,_float,_(glm::qualifier)0> *)&local_a8,&local_98);
    auVar12._8_8_ = 0;
    auVar12._0_4_ = local_98.field_0;
    auVar12._4_4_ = local_98.field_1;
    auVar5._0_4_ = fVar3 * local_a8.field_0.x;
    auVar5._4_4_ = fVar3 * local_a8.field_1.y;
    auVar5._8_4_ = fVar3 * 0.0;
    auVar5._12_4_ = fVar3 * 0.0;
    local_b8.field_2.z = local_98.field_2.z - fVar3 * local_a8.field_2.z;
    auVar4 = vsubps_avx(auVar12,auVar5);
    uVar1 = auVar4._8_8_;
    local_b8._0_8_ = vmovlps_avx(auVar4);
  }
  auVar9 = ZEXT856(uVar1);
  vVar13 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call
                     ((vec<3,_float,_(glm::qualifier)0> *)&local_b8);
  local_b8.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar13.field_2;
  auVar7._0_8_ = vVar13._0_8_;
  auVar7._8_56_ = auVar9;
  local_b8._0_8_ = vmovlpd_avx(auVar7._0_16_);
  vVar13 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call
                     ((vec<3,_float,_(glm::qualifier)0> *)&local_a8,
                      (vec<3,_float,_(glm::qualifier)0> *)&local_b8);
  local_58.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)vVar13.field_2;
  auVar8._0_8_ = vVar13._0_8_;
  auVar8._8_56_ = auVar9;
  local_58.value[0].field_3.w = 0.0;
  local_58.value[1].field_3.w = 0.0;
  local_58.value[2].field_3.w = 0.0;
  local_58.value[3].field_3.w = 1.0;
  local_58.value[0].field_0 = local_a8.field_0;
  local_58.value[0].field_1 = local_a8.field_1;
  local_58.value[0].field_2 = local_a8.field_2;
  local_58.value[1].field_0 = local_b8.field_0;
  local_58.value[1].field_1 = local_b8.field_1;
  local_58.value[1].field_2 = local_b8.field_2;
  local_58.value[2]._0_8_ = vmovlpd_avx(auVar8._0_16_);
  auVar2._8_8_ = uStack_80;
  auVar2._0_8_ = local_88;
  local_58.value[3]._0_8_ = vmovlps_avx(auVar2);
  local_58.value[3].field_2.z = planePosition.field_2;
  PersistentValue<glm::mat<4,4,float,(glm::qualifier)0>>::operator=
            ((PersistentValue<glm::mat<4,4,float,(glm::qualifier)0>> *)&this->objectTransform,
             &local_58);
  requestRedraw();
  return;
}

Assistant:

void SlicePlane::setPose(glm::vec3 planePosition, glm::vec3 planeNormal) {

  // Choose the other axes to be most similar to the current ones, which will make animations look smoother
  // if the grid is shown
  glm::vec3 currBasisX{objectTransform.get()[1][0], objectTransform.get()[1][1], objectTransform.get()[1][2]};
  glm::vec3 currBasisY{objectTransform.get()[2][0], objectTransform.get()[2][1], objectTransform.get()[2][2]};

  glm::vec3 normal = glm::normalize(planeNormal);
  glm::vec3 basisX = currBasisX - normal * glm::dot(normal, currBasisX);
  if (glm::length(basisX) < 0.01) basisX = currBasisY - normal * glm::dot(normal, currBasisY);
  basisX = glm::normalize(basisX);
  glm::vec3 basisY = glm::cross(normal, basisX);

  // Build the rotation component
  glm::mat4x4 newTransform = glm::mat4x4(1.0);
  for (int i = 0; i < 3; i++) newTransform[0][i] = normal[i];
  for (int i = 0; i < 3; i++) newTransform[1][i] = basisX[i];
  for (int i = 0; i < 3; i++) newTransform[2][i] = basisY[i];

  // Build the translation component
  for (int i = 0; i < 3; i++) newTransform[3][i] = planePosition[i];

  objectTransform = newTransform;
  polyscope::requestRedraw();
}